

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void __thiscall net_tests::cnode_simple_test::test_method(cnode_simple_test *this)

{
  long lVar1;
  CService ipIn;
  Network NVar2;
  unique_ptr<CNode,_std::default_delete<CNode>_> *__args_4;
  iterator pvVar3;
  unique_ptr<CNode,_std::default_delete<CNode>_> *puVar4;
  int *__args_4_00;
  CAddress *pCVar5;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  undefined4 in_stack_fffffffffffff878;
  undefined4 in_stack_fffffffffffff87c;
  undefined8 in_stack_fffffffffffff880;
  string *psVar7;
  undefined8 in_stack_fffffffffffff888;
  bool *__args_8;
  bool *pbVar8;
  undefined8 in_stack_fffffffffffff890;
  undefined1 *puVar9;
  bool *pbVar10;
  uint *puVar11;
  undefined8 in_stack_fffffffffffff898;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 local_5d5;
  uint local_5d4;
  unique_ptr<CNode,_std::default_delete<CNode>_> pnode4;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  undefined1 local_444 [4];
  unique_ptr<CNode,_std::default_delete<CNode>_> pnode3;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 local_2b4 [4];
  unique_ptr<CNode,_std::default_delete<CNode>_> pnode2;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 local_148 [16];
  assertion_result local_138;
  NodeSeconds local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  unique_ptr<CNode,_std::default_delete<CNode>_> pnode1;
  in_addr ipv4Addr;
  undefined1 local_f0 [24];
  CAddress *local_d8;
  string pszDest;
  CService local_98;
  CAddress addr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ipv4Addr.s_addr = 0xa0b0c001;
  CService::CService(&local_98,&ipv4Addr,0x1e61);
  ipIn.super_CNetAddr.m_addr._union._4_4_ = in_stack_fffffffffffff87c;
  ipIn.super_CNetAddr.m_addr._union._0_4_ = in_stack_fffffffffffff878;
  ipIn.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffff880;
  ipIn.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff888;
  ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffff890;
  ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff890 >> 0x20);
  ipIn._32_8_ = in_stack_fffffffffffff898;
  CAddress::CAddress(&addr,ipIn,(ServiceFlags)&local_98);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98);
  pszDest._M_dataplus._M_p = (pointer)&pszDest.field_2;
  pszDest._M_string_length = 0;
  local_138._0_8_ = (undefined1 *)0x0;
  local_148._0_8_ = (char *)0x0;
  pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
  super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.super__Head_base<0UL,_CNode_*,_false>
  ._M_head_impl._0_4_ = 0;
  pszDest.field_2._M_local_buf[0] = '\0';
  pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
  super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.super__Head_base<0UL,_CNode_*,_false>
  ._M_head_impl._0_4_ = 0;
  CAddress::CAddress((CAddress *)local_f0);
  puVar4 = &pnode4;
  pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
  super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.super__Head_base<0UL,_CNode_*,_false>
  ._M_head_impl._0_4_ = 1;
  puVar9 = local_2b4;
  local_2b4 = (undefined1  [4])((uint)local_2b4 & 0xffffff00);
  psVar7 = &pszDest;
  __args_4 = &pnode2;
  pCVar5 = (CAddress *)&pnode3;
  std::
  make_unique<CNode,long,decltype(nullptr),CAddress&,int,int,CAddress,std::__cxx11::string&,ConnectionType,bool>
            ((long *)&pnode1,(void **)&local_138,(CAddress *)local_148,(int *)&addr,(int *)__args_4,
             pCVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
             (ConnectionType *)psVar7,(bool *)puVar4);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_f0);
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_108 = "";
  local_120.__d.__r = (duration)&boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x47;
  file.m_begin = (iterator)&local_110;
  msg.m_end = (iterator)pCVar5;
  msg.m_begin = (iterator)__args_4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_120,msg);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode1->IsFullOutboundConn() == true";
  local_148._8_8_ = (long)"pnode1->IsFullOutboundConn() == true" + 0x24;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_150 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (*(int *)((long)pnode1._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
                       super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                       super__Head_base<0UL,_CNode_*,_false>._M_head_impl + 0x244) == 1);
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_158,0x47
             ,puVar4,puVar9);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x48;
  file_00.m_begin = (iterator)&local_168;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
             msg_00);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)((long)pnode1._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
                       super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                       super__Head_base<0UL,_CNode_*,_false>._M_head_impl + 0x244) != 2);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode1->IsManualConn() == false";
  local_148._8_8_ = (long)"pnode1->IsManualConn() == false" + 0x1f;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_180 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_188,0x48
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x49;
  file_01.m_begin = (iterator)&local_198;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
             msg_01);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)((long)pnode1._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
                       super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                       super__Head_base<0UL,_CNode_*,_false>._M_head_impl + 0x244) != 4);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode1->IsBlockOnlyConn() == false";
  local_148._8_8_ = (long)"pnode1->IsBlockOnlyConn() == false" + 0x22;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1b0 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_1b8,0x49
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4a;
  file_02.m_begin = (iterator)&local_1c8;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d8,
             msg_02);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)((long)pnode1._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
                       super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                       super__Head_base<0UL,_CNode_*,_false>._M_head_impl + 0x244) != 3);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode1->IsFeelerConn() == false";
  local_148._8_8_ = (long)"pnode1->IsFeelerConn() == false" + 0x1f;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1e0 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_1e8,0x4a
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x4b;
  file_03.m_begin = (iterator)&local_1f8;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_208,
             msg_03);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)((long)pnode1._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
                       super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                       super__Head_base<0UL,_CNode_*,_false>._M_head_impl + 0x244) != 5);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode1->IsAddrFetchConn() == false";
  local_148._8_8_ = (long)"pnode1->IsAddrFetchConn() == false" + 0x22;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_210 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_218,0x4b
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x4c;
  file_04.m_begin = (iterator)&local_228;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_238,
             msg_04);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)((long)pnode1._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
                       super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                       super__Head_base<0UL,_CNode_*,_false>._M_head_impl + 0x244) != 0);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode1->IsInboundConn() == false";
  local_148._8_8_ = (long)"pnode1->IsInboundConn() == false" + 0x20;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_240 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_248,0x4c
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x4d;
  file_05.m_begin = (iterator)&local_258;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_268,
             msg_05);
  local_138._0_8_ =
       CONCAT71(local_138._1_7_,
                *(undefined1 *)
                 ((long)pnode1._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
                        super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                        super__Head_base<0UL,_CNode_*,_false>._M_head_impl + 0x1c8)) ^ 1;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode1->m_inbound_onion == false";
  local_148._8_8_ = (long)"pnode1->m_inbound_onion == false" + 0x20;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_270 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_278,0x4d
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x4e;
  file_06.m_begin = (iterator)&local_288;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_298,
             msg_06);
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_d8 = (CAddress *)0xc7f1cc;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_2a0 = "";
  NVar2 = CNode::ConnectedThroughNetwork
                    ((CNode *)pnode1._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                              _M_t.super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                              super__Head_base<0UL,_CNode_*,_false>._M_head_impl);
  local_138._0_4_ = NVar2;
  local_148._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
            (local_f0,&local_2a8,0x4e,1,2,&local_138,0xbc3cc4,(CAddress *)local_148,
             "Network::NET_IPV4");
  local_148._0_8_ = (char *)0x0;
  local_138._0_8_ = &DAT_00000001;
  pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
  super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.super__Head_base<0UL,_CNode_*,_false>
  ._M_head_impl._0_4_ = 1;
  pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
  super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.super__Head_base<0UL,_CNode_*,_false>
  ._M_head_impl._0_4_ = 1;
  CAddress::CAddress((CAddress *)local_f0);
  local_2b4 = (undefined1  [4])0x0;
  pbVar8 = (bool *)local_444;
  local_444 = (undefined1  [4])((uint)local_444 & 0xffffff00);
  __args_8 = (bool *)local_2b4;
  psVar7 = &pszDest;
  puVar4 = &pnode3;
  pCVar5 = (CAddress *)&pnode4;
  pbVar10 = pbVar8;
  std::
  make_unique<CNode,long,decltype(nullptr),CAddress&,int,int,CAddress,std::__cxx11::string&,ConnectionType,bool>
            ((long *)&pnode2,(void **)&local_138,(CAddress *)local_148,(int *)&addr,(int *)puVar4,
             pCVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
             (ConnectionType *)psVar7,__args_8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_f0);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x59;
  file_07.m_begin = (iterator)&local_2c8;
  msg_07.m_end = (iterator)pCVar5;
  msg_07.m_begin = (iterator)puVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2d8,
             msg_07);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode2->IsFullOutboundConn() == false";
  local_148._8_8_ = (long)"pnode2->IsFullOutboundConn() == false" + 0x25;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_2e0 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 1);
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_2e8,0x59
             ,__args_8,pbVar10);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x5a;
  file_08.m_begin = (iterator)&local_2f8;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_308,
             msg_08);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 2);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode2->IsManualConn() == false";
  local_148._8_8_ = (long)"pnode2->IsManualConn() == false" + 0x1f;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_310 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_318,0x5a
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x5b;
  file_09.m_begin = (iterator)&local_328;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_338,
             msg_09);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 4);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode2->IsBlockOnlyConn() == false";
  local_148._8_8_ = (long)"pnode2->IsBlockOnlyConn() == false" + 0x22;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_340 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_348,0x5b
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x5c;
  file_10.m_begin = (iterator)&local_358;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_368,
             msg_10);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 3);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode2->IsFeelerConn() == false";
  local_148._8_8_ = (long)"pnode2->IsFeelerConn() == false" + 0x1f;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_370 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_378,0x5c
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x5d;
  file_11.m_begin = (iterator)&local_388;
  msg_11.m_end = pvVar6;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_398,
             msg_11);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 5);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode2->IsAddrFetchConn() == false";
  local_148._8_8_ = (long)"pnode2->IsAddrFetchConn() == false" + 0x22;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_3a0 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_3a8,0x5d
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x5e;
  file_12.m_begin = (iterator)&local_3b8;
  msg_12.m_end = pvVar6;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3c8,
             msg_12);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) == 0);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode2->IsInboundConn() == true";
  local_148._8_8_ = (long)"pnode2->IsInboundConn() == true" + 0x1f;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_3d0 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_3d8,0x5e
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x5f;
  file_13.m_begin = (iterator)&local_3e8;
  msg_13.m_end = pvVar6;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3f8,
             msg_13);
  local_138._0_8_ =
       CONCAT71(local_138._1_7_,
                *(undefined1 *)
                 (CONCAT44(pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                           _M_t.super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                           super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                           pnode2._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                           _M_t.super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                           super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x1c8)) ^ 1;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode2->m_inbound_onion == false";
  local_148._8_8_ = (long)"pnode2->m_inbound_onion == false" + 0x20;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_400 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_408,0x5f
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x60;
  file_14.m_begin = (iterator)&local_418;
  msg_14.m_end = pvVar6;
  msg_14.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_428,
             msg_14);
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_d8 = (CAddress *)0xc7f1cc;
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_430 = "";
  NVar2 = CNode::ConnectedThroughNetwork
                    ((CNode *)CONCAT44(pnode2._M_t.
                                       super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                                       super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                                       pnode2._M_t.
                                       super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                                       super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_));
  local_138._0_4_ = NVar2;
  local_148._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
            (local_f0,&local_438,0x60,1,2,&local_138,0xbc3de5,(CAddress *)local_148,
             "Network::NET_IPV4");
  local_148._0_8_ = (char *)0x0;
  pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
  super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.super__Head_base<0UL,_CNode_*,_false>
  ._M_head_impl._0_4_ = 0;
  local_138._0_8_ = (undefined1 *)0x2;
  local_2b4 = (undefined1  [4])0x0;
  CAddress::CAddress((CAddress *)local_f0);
  local_444 = (undefined1  [4])0x1;
  puVar11 = &local_5d4;
  local_5d4 = local_5d4 & 0xffffff00;
  psVar7 = &pszDest;
  puVar4 = &pnode4;
  pCVar5 = (CAddress *)local_2b4;
  std::
  make_unique<CNode,long,decltype(nullptr),CAddress&,int,int,CAddress,std::__cxx11::string&,ConnectionType,bool>
            ((long *)&pnode3,(void **)&local_138,(CAddress *)local_148,(int *)&addr,(int *)puVar4,
             pCVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
             (ConnectionType *)psVar7,pbVar8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_f0);
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x6b;
  file_15.m_begin = (iterator)&local_458;
  msg_15.m_end = (iterator)pCVar5;
  msg_15.m_begin = (iterator)puVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_468,
             msg_15);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode3->IsFullOutboundConn() == true";
  local_148._8_8_ = (long)"pnode3->IsFullOutboundConn() == true" + 0x24;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_470 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) == 1);
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_478,0x6b
             ,pbVar8,puVar11);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x6c;
  file_16.m_begin = (iterator)&local_488;
  msg_16.m_end = pvVar6;
  msg_16.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_498,
             msg_16);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 2);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode3->IsManualConn() == false";
  local_148._8_8_ = (long)"pnode3->IsManualConn() == false" + 0x1f;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_4a0 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_4a8,0x6c
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x6d;
  file_17.m_begin = (iterator)&local_4b8;
  msg_17.m_end = pvVar6;
  msg_17.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_4c8,
             msg_17);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 4);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode3->IsBlockOnlyConn() == false";
  local_148._8_8_ = (long)"pnode3->IsBlockOnlyConn() == false" + 0x22;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_4d0 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_4d8,0x6d
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x6e;
  file_18.m_begin = (iterator)&local_4e8;
  msg_18.m_end = pvVar6;
  msg_18.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_4f8,
             msg_18);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 3);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode3->IsFeelerConn() == false";
  local_148._8_8_ = (long)"pnode3->IsFeelerConn() == false" + 0x1f;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_500 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_508,0x6e
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x6f;
  file_19.m_begin = (iterator)&local_518;
  msg_19.m_end = pvVar6;
  msg_19.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_528,
             msg_19);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 5);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode3->IsAddrFetchConn() == false";
  local_148._8_8_ = (long)"pnode3->IsAddrFetchConn() == false" + 0x22;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_530 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_538,0x6f
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x70;
  file_20.m_begin = (iterator)&local_548;
  msg_20.m_end = pvVar6;
  msg_20.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_558,
             msg_20);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 0);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode3->IsInboundConn() == false";
  local_148._8_8_ = (long)"pnode3->IsInboundConn() == false" + 0x20;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_560 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_568,0x70
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x71;
  file_21.m_begin = (iterator)&local_578;
  msg_21.m_end = pvVar6;
  msg_21.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_588,
             msg_21);
  local_138._0_8_ =
       CONCAT71(local_138._1_7_,
                *(undefined1 *)
                 (CONCAT44(pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                           _M_t.super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                           super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                           pnode3._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                           _M_t.super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                           super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x1c8)) ^ 1;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode3->m_inbound_onion == false";
  local_148._8_8_ = (long)"pnode3->m_inbound_onion == false" + 0x20;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_590 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_598,0x71
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x72;
  file_22.m_begin = (iterator)&local_5a8;
  msg_22.m_end = pvVar6;
  msg_22.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_5b8,
             msg_22);
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_d8 = (CAddress *)0xc7f1cc;
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_5c0 = "";
  NVar2 = CNode::ConnectedThroughNetwork
                    ((CNode *)CONCAT44(pnode3._M_t.
                                       super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                                       super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                                       pnode3._M_t.
                                       super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                                       super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_));
  local_138._0_4_ = NVar2;
  local_148._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
            (local_f0,&local_5c8,0x72,1,2,&local_138,0xbc3ef4,(CAddress *)local_148,
             "Network::NET_IPV4");
  local_148._0_8_ = (char *)0x0;
  local_138._0_8_ = (undefined1 *)0x3;
  local_444 = (undefined1  [4])1;
  local_2b4 = (undefined1  [4])1;
  CAddress::CAddress((CAddress *)local_f0);
  local_5d4 = 0;
  puVar9 = &local_5d5;
  local_5d5 = 1;
  pbVar8 = (bool *)&local_5d4;
  psVar7 = &pszDest;
  __args_4_00 = (int *)local_2b4;
  pCVar5 = (CAddress *)local_444;
  std::
  make_unique<CNode,long,decltype(nullptr),CAddress&,int,int,CAddress,std::__cxx11::string&,ConnectionType,bool>
            ((long *)&pnode4,(void **)&local_138,(CAddress *)local_148,(int *)&addr,__args_4_00,
             pCVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
             (ConnectionType *)psVar7,pbVar8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_f0);
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x7d;
  file_23.m_begin = (iterator)&local_5e8;
  msg_23.m_end = (iterator)pCVar5;
  msg_23.m_begin = (iterator)__args_4_00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_5f8,
             msg_23);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode4->IsFullOutboundConn() == false";
  local_148._8_8_ = (long)"pnode4->IsFullOutboundConn() == false" + 0x25;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_608 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_600 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 1);
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_608,0x7d
             ,pbVar8,puVar9);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x7e;
  file_24.m_begin = (iterator)&local_618;
  msg_24.m_end = pvVar6;
  msg_24.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_628,
             msg_24);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 2);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode4->IsManualConn() == false";
  local_148._8_8_ = (long)"pnode4->IsManualConn() == false" + 0x1f;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_630 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_638,0x7e
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x7f;
  file_25.m_begin = (iterator)&local_648;
  msg_25.m_end = pvVar6;
  msg_25.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_658,
             msg_25);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 4);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode4->IsBlockOnlyConn() == false";
  local_148._8_8_ = (long)"pnode4->IsBlockOnlyConn() == false" + 0x22;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_660 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_668,0x7f
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x80;
  file_26.m_begin = (iterator)&local_678;
  msg_26.m_end = pvVar6;
  msg_26.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_688,
             msg_26);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 3);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode4->IsFeelerConn() == false";
  local_148._8_8_ = (long)"pnode4->IsFeelerConn() == false" + 0x1f;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_690 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_698,0x80
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x81;
  file_27.m_begin = (iterator)&local_6a8;
  msg_27.m_end = pvVar6;
  msg_27.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_6b8,
             msg_27);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) != 5);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode4->IsAddrFetchConn() == false";
  local_148._8_8_ = (long)"pnode4->IsAddrFetchConn() == false" + 0x22;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_6c0 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_6c8,0x81
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x82;
  file_28.m_begin = (iterator)&local_6d8;
  msg_28.m_end = pvVar6;
  msg_28.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_6e8,
             msg_28);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(int *)(CONCAT44(pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                          pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t
                          .super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                          super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x244) == 0);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode4->IsInboundConn() == true";
  local_148._8_8_ = (long)"pnode4->IsInboundConn() == true" + 0x1f;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_6f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_6f0 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_6f8,0x82
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x83;
  file_29.m_begin = (iterator)&local_708;
  msg_29.m_end = pvVar6;
  msg_29.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_718,
             msg_29);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       *(undefined1 *)
        (CONCAT44(pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
                  super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                  super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                  pnode4._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
                  super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                  super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_) + 0x1c8);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "pnode4->m_inbound_onion == true";
  local_148._8_8_ = (long)"pnode4->m_inbound_onion == true" + 0x1f;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_720 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_d8 = (CAddress *)local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar7,(size_t)&local_728,0x83
            );
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_738 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_730 = "";
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x84;
  file_30.m_begin = (iterator)&local_738;
  msg_30.m_end = pvVar6;
  msg_30.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_748,
             msg_30);
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_d8 = (CAddress *)0xc7f1cc;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_750 = "";
  NVar2 = CNode::ConnectedThroughNetwork
                    ((CNode *)CONCAT44(pnode4._M_t.
                                       super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                                       super__Head_base<0UL,_CNode_*,_false>._M_head_impl._4_4_,
                                       pnode4._M_t.
                                       super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                                       super__Head_base<0UL,_CNode_*,_false>._M_head_impl._0_4_));
  local_138._0_4_ = NVar2;
  local_148._0_4_ = 3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
            (local_f0,&local_758,0x84,1,2,&local_138,0xbc4002,(CAddress *)local_148,
             "Network::NET_ONION");
  std::unique_ptr<CNode,_std::default_delete<CNode>_>::~unique_ptr(&pnode4);
  std::unique_ptr<CNode,_std::default_delete<CNode>_>::~unique_ptr(&pnode3);
  std::unique_ptr<CNode,_std::default_delete<CNode>_>::~unique_ptr(&pnode2);
  std::unique_ptr<CNode,_std::default_delete<CNode>_>::~unique_ptr(&pnode1);
  std::__cxx11::string::~string((string *)&pszDest);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(cnode_simple_test)
{
    NodeId id = 0;

    in_addr ipv4Addr;
    ipv4Addr.s_addr = 0xa0b0c001;

    CAddress addr = CAddress(CService(ipv4Addr, 7777), NODE_NETWORK);
    std::string pszDest;

    std::unique_ptr<CNode> pnode1 = std::make_unique<CNode>(id++,
                                                            /*sock=*/nullptr,
                                                            addr,
                                                            /*nKeyedNetGroupIn=*/0,
                                                            /*nLocalHostNonceIn=*/0,
                                                            CAddress(),
                                                            pszDest,
                                                            ConnectionType::OUTBOUND_FULL_RELAY,
                                                            /*inbound_onion=*/false);
    BOOST_CHECK(pnode1->IsFullOutboundConn() == true);
    BOOST_CHECK(pnode1->IsManualConn() == false);
    BOOST_CHECK(pnode1->IsBlockOnlyConn() == false);
    BOOST_CHECK(pnode1->IsFeelerConn() == false);
    BOOST_CHECK(pnode1->IsAddrFetchConn() == false);
    BOOST_CHECK(pnode1->IsInboundConn() == false);
    BOOST_CHECK(pnode1->m_inbound_onion == false);
    BOOST_CHECK_EQUAL(pnode1->ConnectedThroughNetwork(), Network::NET_IPV4);

    std::unique_ptr<CNode> pnode2 = std::make_unique<CNode>(id++,
                                                            /*sock=*/nullptr,
                                                            addr,
                                                            /*nKeyedNetGroupIn=*/1,
                                                            /*nLocalHostNonceIn=*/1,
                                                            CAddress(),
                                                            pszDest,
                                                            ConnectionType::INBOUND,
                                                            /*inbound_onion=*/false);
    BOOST_CHECK(pnode2->IsFullOutboundConn() == false);
    BOOST_CHECK(pnode2->IsManualConn() == false);
    BOOST_CHECK(pnode2->IsBlockOnlyConn() == false);
    BOOST_CHECK(pnode2->IsFeelerConn() == false);
    BOOST_CHECK(pnode2->IsAddrFetchConn() == false);
    BOOST_CHECK(pnode2->IsInboundConn() == true);
    BOOST_CHECK(pnode2->m_inbound_onion == false);
    BOOST_CHECK_EQUAL(pnode2->ConnectedThroughNetwork(), Network::NET_IPV4);

    std::unique_ptr<CNode> pnode3 = std::make_unique<CNode>(id++,
                                                            /*sock=*/nullptr,
                                                            addr,
                                                            /*nKeyedNetGroupIn=*/0,
                                                            /*nLocalHostNonceIn=*/0,
                                                            CAddress(),
                                                            pszDest,
                                                            ConnectionType::OUTBOUND_FULL_RELAY,
                                                            /*inbound_onion=*/false);
    BOOST_CHECK(pnode3->IsFullOutboundConn() == true);
    BOOST_CHECK(pnode3->IsManualConn() == false);
    BOOST_CHECK(pnode3->IsBlockOnlyConn() == false);
    BOOST_CHECK(pnode3->IsFeelerConn() == false);
    BOOST_CHECK(pnode3->IsAddrFetchConn() == false);
    BOOST_CHECK(pnode3->IsInboundConn() == false);
    BOOST_CHECK(pnode3->m_inbound_onion == false);
    BOOST_CHECK_EQUAL(pnode3->ConnectedThroughNetwork(), Network::NET_IPV4);

    std::unique_ptr<CNode> pnode4 = std::make_unique<CNode>(id++,
                                                            /*sock=*/nullptr,
                                                            addr,
                                                            /*nKeyedNetGroupIn=*/1,
                                                            /*nLocalHostNonceIn=*/1,
                                                            CAddress(),
                                                            pszDest,
                                                            ConnectionType::INBOUND,
                                                            /*inbound_onion=*/true);
    BOOST_CHECK(pnode4->IsFullOutboundConn() == false);
    BOOST_CHECK(pnode4->IsManualConn() == false);
    BOOST_CHECK(pnode4->IsBlockOnlyConn() == false);
    BOOST_CHECK(pnode4->IsFeelerConn() == false);
    BOOST_CHECK(pnode4->IsAddrFetchConn() == false);
    BOOST_CHECK(pnode4->IsInboundConn() == true);
    BOOST_CHECK(pnode4->m_inbound_onion == true);
    BOOST_CHECK_EQUAL(pnode4->ConnectedThroughNetwork(), Network::NET_ONION);
}